

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceIntersector1>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  InstancePrimitive *prim;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined4 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  Precalculations pre;
  NodeRef stack [564];
  Precalculations local_1301;
  Ray *local_1300;
  ulong local_12f8;
  ulong *local_12f0;
  RayQueryContext *local_12e8;
  long local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      aVar2 = (ray->dir).field_0.field_1;
      auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar14._8_4_ = 0x7fffffff;
      auVar14._0_8_ = 0x7fffffff7fffffff;
      auVar14._12_4_ = 0x7fffffff;
      auVar14 = vandps_avx512vl((undefined1  [16])aVar2,auVar14);
      auVar23._8_4_ = 0x219392ef;
      auVar23._0_8_ = 0x219392ef219392ef;
      auVar23._12_4_ = 0x219392ef;
      local_12f0 = local_11d0;
      uVar12 = vcmpps_avx512vl(auVar14,auVar23,1);
      bVar5 = (bool)((byte)uVar12 & 1);
      auVar15._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)aVar2.x;
      bVar5 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar15._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)aVar2.y;
      bVar5 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar15._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)aVar2.z;
      bVar5 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar15._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * aVar2.field_3.a;
      auVar14 = vrcp14ps_avx512vl(auVar15);
      auVar16._8_4_ = 0x3f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._12_4_ = 0x3f800000;
      auVar16 = vfnmadd213ps_avx512vl(auVar15,auVar14,auVar16);
      auVar15 = vfmadd132ps_fma(auVar16,auVar14,auVar14);
      fVar17 = auVar15._0_4_;
      local_11f8._4_4_ = fVar17;
      local_11f8._0_4_ = fVar17;
      local_11f8._8_4_ = fVar17;
      local_11f8._12_4_ = fVar17;
      local_11f8._16_4_ = fVar17;
      local_11f8._20_4_ = fVar17;
      local_11f8._24_4_ = fVar17;
      local_11f8._28_4_ = fVar17;
      auVar30 = ZEXT3264(local_11f8);
      auVar14 = vmovshdup_avx(auVar15);
      uVar21 = auVar14._0_8_;
      local_1218._8_8_ = uVar21;
      local_1218._0_8_ = uVar21;
      local_1218._16_8_ = uVar21;
      local_1218._24_8_ = uVar21;
      auVar31 = ZEXT3264(local_1218);
      auVar16 = vshufpd_avx(auVar15,auVar15,1);
      auVar25._8_4_ = 2;
      auVar25._0_8_ = 0x200000002;
      auVar25._12_4_ = 2;
      auVar25._16_4_ = 2;
      auVar25._20_4_ = 2;
      auVar25._24_4_ = 2;
      auVar25._28_4_ = 2;
      local_1238 = vpermps_avx2(auVar25,ZEXT1632(auVar15));
      auVar32 = ZEXT3264(local_1238);
      fVar18 = fVar17 * (ray->org).field_0.m128[0];
      auVar28._8_4_ = 1;
      auVar28._0_8_ = 0x100000001;
      auVar28._12_4_ = 1;
      auVar28._16_4_ = 1;
      auVar28._20_4_ = 1;
      auVar28._24_4_ = 1;
      auVar28._28_4_ = 1;
      auVar19 = ZEXT1632(CONCAT412(auVar15._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar15._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar15._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar18))));
      auVar28 = vpermps_avx2(auVar28,auVar19);
      auVar19 = vpermps_avx2(auVar25,auVar19);
      local_12f8 = (ulong)(fVar17 < 0.0) << 5;
      uVar10 = (ulong)(auVar14._0_4_ < 0.0) << 5 | 0x40;
      uVar13 = (ulong)(auVar16._0_4_ < 0.0) << 5 | 0x80;
      uVar11 = local_12f8 ^ 0x20;
      local_1258._0_8_ = CONCAT44(fVar18,fVar18) ^ 0x8000000080000000;
      local_1258._8_4_ = -fVar18;
      local_1258._12_4_ = -fVar18;
      local_1258._16_4_ = -fVar18;
      local_1258._20_4_ = -fVar18;
      local_1258._24_4_ = -fVar18;
      local_1258._28_4_ = -fVar18;
      auVar22 = ZEXT3264(local_1258);
      local_1278._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
      local_1278._8_4_ = auVar28._8_4_ ^ 0x80000000;
      local_1278._12_4_ = auVar28._12_4_ ^ 0x80000000;
      local_1278._16_4_ = auVar28._16_4_ ^ 0x80000000;
      local_1278._20_4_ = auVar28._20_4_ ^ 0x80000000;
      local_1278._24_4_ = auVar28._24_4_ ^ 0x80000000;
      local_1278._28_4_ = auVar28._28_4_ ^ 0x80000000;
      auVar24 = ZEXT3264(local_1278);
      local_1298._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
      local_1298._8_4_ = auVar19._8_4_ ^ 0x80000000;
      local_1298._12_4_ = auVar19._12_4_ ^ 0x80000000;
      local_1298._16_4_ = auVar19._16_4_ ^ 0x80000000;
      local_1298._20_4_ = auVar19._20_4_ ^ 0x80000000;
      local_1298._24_4_ = auVar19._24_4_ ^ 0x80000000;
      local_1298._28_4_ = auVar19._28_4_ ^ 0x80000000;
      auVar26 = ZEXT3264(local_1298);
      uVar20 = auVar4._0_4_;
      local_12b8._4_4_ = uVar20;
      local_12b8._0_4_ = uVar20;
      local_12b8._8_4_ = uVar20;
      local_12b8._12_4_ = uVar20;
      local_12b8._16_4_ = uVar20;
      local_12b8._20_4_ = uVar20;
      local_12b8._24_4_ = uVar20;
      local_12b8._28_4_ = uVar20;
      auVar27 = ZEXT3264(local_12b8);
      local_12d8._4_4_ = fVar1;
      local_12d8._0_4_ = fVar1;
      local_12d8._8_4_ = fVar1;
      local_12d8._12_4_ = fVar1;
      local_12d8._16_4_ = fVar1;
      local_12d8._20_4_ = fVar1;
      local_12d8._24_4_ = fVar1;
      local_12d8._28_4_ = fVar1;
      auVar29 = ZEXT3264(local_12d8);
      uVar12 = local_12f8;
      local_1300 = ray;
      local_12e8 = context;
LAB_0069bcae:
      do {
        uVar3 = local_12f0[-1];
        local_12f0 = local_12f0 + -1;
        while ((uVar3 & 8) == 0) {
          auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar3 + 0x40 + uVar12),auVar22._0_32_,
                                   auVar30._0_32_);
          auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar3 + 0x40 + uVar10),auVar24._0_32_,
                                    auVar31._0_32_);
          auVar28 = vpmaxsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar14));
          auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar3 + 0x40 + uVar13),auVar26._0_32_,
                                   auVar32._0_32_);
          auVar19 = vpmaxsd_avx2(ZEXT1632(auVar4),auVar27._0_32_);
          auVar28 = vpmaxsd_avx2(auVar28,auVar19);
          auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar3 + 0x40 + uVar11),auVar22._0_32_,
                                   auVar30._0_32_);
          auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar3 + 0x40 + (uVar10 ^ 0x20)),
                                    auVar24._0_32_,auVar31._0_32_);
          auVar19 = vpminsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar14));
          auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar3 + 0x40 + (uVar13 ^ 0x20)),
                                   auVar26._0_32_,auVar32._0_32_);
          auVar25 = vpminsd_avx2(ZEXT1632(auVar4),auVar29._0_32_);
          auVar19 = vpminsd_avx2(auVar19,auVar25);
          uVar8 = vpcmpd_avx512vl(auVar28,auVar19,2);
          if ((char)uVar8 == '\0') {
            if (local_12f0 == &local_11d8) {
              return;
            }
            goto LAB_0069bcae;
          }
          uVar6 = uVar3 & 0xfffffffffffffff0;
          lVar9 = 0;
          for (uVar3 = uVar8; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
            lVar9 = lVar9 + 1;
          }
          uVar3 = *(ulong *)(uVar6 + lVar9 * 8);
          uVar7 = (uint)uVar8 - 1 & (uint)uVar8;
          uVar8 = (ulong)uVar7;
          if (uVar7 != 0) {
            *local_12f0 = uVar3;
            lVar9 = 0;
            for (; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
              lVar9 = lVar9 + 1;
            }
            uVar7 = uVar7 - 1 & uVar7;
            uVar8 = (ulong)uVar7;
            bVar5 = uVar7 == 0;
            while( true ) {
              local_12f0 = local_12f0 + 1;
              uVar3 = *(ulong *)(uVar6 + lVar9 * 8);
              if (bVar5) break;
              *local_12f0 = uVar3;
              lVar9 = 0;
              for (uVar3 = uVar8; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
                lVar9 = lVar9 + 1;
              }
              uVar8 = uVar8 - 1 & uVar8;
              bVar5 = uVar8 == 0;
            }
          }
        }
        local_12e0 = (ulong)((uint)uVar3 & 0xf) - 8;
        if (local_12e0 != 0) {
          prim = (InstancePrimitive *)(uVar3 & 0xfffffffffffffff0);
          do {
            bVar5 = InstanceIntersector1::occluded(&local_1301,ray,local_12e8,prim);
            if (bVar5) {
              local_1300->tfar = -INFINITY;
              return;
            }
            prim = prim + 1;
            local_12e0 = local_12e0 + -1;
            ray = local_1300;
          } while (local_12e0 != 0);
        }
        auVar30 = ZEXT3264(local_11f8);
        auVar31 = ZEXT3264(local_1218);
        auVar32 = ZEXT3264(local_1238);
        auVar22 = ZEXT3264(local_1258);
        auVar24 = ZEXT3264(local_1278);
        auVar26 = ZEXT3264(local_1298);
        auVar27 = ZEXT3264(local_12b8);
        auVar29 = ZEXT3264(local_12d8);
        uVar12 = local_12f8;
      } while (local_12f0 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }